

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

logic_t slang::ast::checkInsideMatch(ConstantValue *cvl,ConstantValue *cvr)

{
  bool bVar1;
  ConstantValue *in_RSI;
  logic_t result;
  ConstantValue *elem;
  CVIterator<true> __end3;
  CVIterator<true> __begin3;
  ConstantValue *__range3;
  bool anyUnknown;
  CVIterator<true> *in_stack_ffffffffffffff68;
  iterator_facade<slang::CVIterator<true>,_false> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  logic_t in_stack_ffffffffffffff7f;
  SVInt *in_stack_ffffffffffffffd0;
  SVInt *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  logic_t local_1;
  
  bVar1 = slang::ConstantValue::isContainer((ConstantValue *)in_stack_ffffffffffffff70);
  if (bVar1) {
    bVar2 = 0;
    begin<const_slang::ConstantValue,_true>
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff7f.value,in_stack_ffffffffffffff78))
    ;
    end<const_slang::ConstantValue,_true>
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff7f.value,in_stack_ffffffffffffff78))
    ;
    while (bVar1 = operator==<slang::CVIterator<true>_>
                             ((self_type *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      iterator_facade<slang::CVIterator<true>,_false>::operator*
                ((iterator_facade<slang::CVIterator<true>,_false> *)0xbb550e);
      checkInsideMatch(in_RSI,(ConstantValue *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
      bVar1 = logic_t::operator_cast_to_bool((logic_t *)in_stack_ffffffffffffff70);
      if (bVar1) {
        logic_t::logic_t(&local_1,'\x01');
        return (logic_t)local_1.value;
      }
      bVar1 = logic_t::isUnknown((logic_t *)&stack0xffffffffffffff7f);
      if (bVar1) {
        bVar2 = 1;
      }
      iterator_facade<slang::CVIterator<true>,_false>::operator++<slang::CVIterator<true>_>
                (in_stack_ffffffffffffff70);
    }
    if ((bVar2 & 1) == 0) {
      logic_t::logic_t(&local_1,'\0');
    }
    else {
      local_1.value = 0x80;
    }
  }
  else {
    bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xbb55b0);
    if ((bVar1) && (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xbb55c3), bVar1)) {
      slang::ConstantValue::integer((ConstantValue *)0xbb55d6);
      slang::ConstantValue::integer((ConstantValue *)0xbb55e8);
      local_1 = condWildcardEqual(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
    else {
      bVar1 = slang::operator==((ConstantValue *)in_stack_ffffffffffffff70,
                                (ConstantValue *)in_stack_ffffffffffffff68);
      logic_t::logic_t(&local_1,bVar1);
    }
  }
  return (logic_t)local_1.value;
}

Assistant:

static logic_t checkInsideMatch(const ConstantValue& cvl, const ConstantValue& cvr) {
    // Unpacked arrays get unwrapped into their members for comparison.
    if (cvr.isContainer()) {
        bool anyUnknown = false;
        for (auto& elem : cvr) {
            logic_t result = checkInsideMatch(cvl, elem);
            if (result)
                return logic_t(true);

            if (result.isUnknown())
                anyUnknown = true;
        }

        return anyUnknown ? logic_t::x : logic_t(0);
    }

    // Otherwise, we do a wildcard comparison if both sides are integers
    // and an equivalence comparison if not.
    if (cvl.isInteger() && cvr.isInteger())
        return condWildcardEqual(cvl.integer(), cvr.integer());

    return logic_t(cvl == cvr);
}